

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O1

int get_attr(attr_list list,int index,atom_t *name,attr_value_type *val_type,attr_value *value)

{
  attr_list list_00;
  int_attr_struct *piVar1;
  int iVar2;
  double dVar3;
  long lVar4;
  
  if (list->list_of_lists == 0) {
    piVar1 = (list->l).list.iattrs;
    lVar4 = (long)index;
    if (index < (int)(uint)piVar1->int_attr_count) {
      *name = piVar1->iattr[lVar4].attr_id;
      *val_type = Attr_Int4;
      dVar3 = (double)(long)((list->l).list.iattrs)->iattr[lVar4].value;
    }
    else {
      lVar4 = lVar4 - (ulong)piVar1->int_attr_count;
      if ((int)(uint)piVar1->other_attr_count <= (int)lVar4) goto LAB_00105c30;
      *name = (list->l).list.attributes[lVar4].attr_id;
      *val_type = (list->l).list.attributes[lVar4].val_type;
      dVar3 = (list->l).list.attributes[lVar4].value.u.d;
    }
    *value = (attr_value)dVar3;
    iVar2 = 1;
  }
  else {
    if (0 < (list->l).lists.sublist_count) {
      lVar4 = 0;
      do {
        list_00 = (list->l).lists.lists[lVar4];
        iVar2 = attr_count(list_00);
        if (index < iVar2) {
          iVar2 = get_attr(list_00,index,name,val_type,value);
          return iVar2;
        }
        lVar4 = lVar4 + 1;
        index = index - iVar2;
      } while (lVar4 < (list->l).lists.sublist_count);
    }
LAB_00105c30:
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
get_attr(attr_list list,int index, atom_t *name,
	  attr_value_type *val_type, attr_value *value)
{
    if (!list->list_of_lists) {
	if (index < list->l.list.iattrs->int_attr_count) {
	    *name = list->l.list.iattrs->iattr[index].attr_id;
	    *val_type = Attr_Int4;
	    *value = (attr_value) (long) list->l.list.iattrs->iattr[index].value;
	    return 1;
	}
	index -= list->l.list.iattrs->int_attr_count;
	if (index < list->l.list.iattrs->other_attr_count) {
	    *name = list->l.list.attributes[index].attr_id;
	    *val_type = list->l.list.attributes[index].val_type;
	    *value = (int64_t)list->l.list.attributes[index].value.u.l;
	    return 1;
	}
	return 0;
    } else {
        int i;
        for (i=0; i<list->l.lists.sublist_count; i++) {
            int count = attr_count(list->l.lists.lists[i]);
            if (index < count) {
                return get_attr(list->l.lists.lists[i], index, name, 
				val_type, value);
            } else {
                index -= count;
            }
        }
        return 0;
    }   
}